

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  int iVar1;
  TypeFunction *pTVar3;
  TypeFunction *pTVar4;
  TypeHandle *pTVar5;
  Node *pNVar6;
  TypeHandle *pTVar7;
  TypeHandle *pTVar8;
  Node *pNVar9;
  bool bVar10;
  NodeIterator NVar11;
  Node *pNVar2;
  
  pTVar5 = arguments.head;
  NVar11 = DirectChainedMap<TypeFunction_*>::first(table,hash);
  pNVar2 = NVar11.start;
  if (NVar11.node == (Node *)0x0) {
LAB_001dfd8f:
    pTVar4 = (TypeFunction *)0x0;
  }
  else {
    do {
      pNVar6 = NVar11.node;
      pTVar3 = (TypeFunction *)NVar11.start;
      if (pNVar6 == (Node *)0x0) goto LAB_001dfd8f;
      pTVar4 = *(TypeFunction **)(pNVar6 + 8);
      if (pTVar4->returnType == returnType) {
        pTVar7 = (pTVar4->arguments).head;
        pTVar8 = pTVar5;
        if (pTVar7 != (TypeHandle *)0x0 && pTVar5 != (TypeHandle *)0x0) {
          while (pTVar7->type == pTVar8->type) {
            pTVar8 = pTVar8->next;
            pTVar7 = pTVar7->next;
            if ((pTVar7 == (TypeHandle *)0x0) || (pTVar8 == (TypeHandle *)0x0)) break;
          }
        }
        bVar10 = pTVar7 != pTVar8;
        if (bVar10) {
          pNVar9 = *(Node **)(pNVar6 + 0x10);
          bVar10 = true;
          if (pNVar9 != pNVar2) {
            iVar1 = *(int *)pNVar6;
            do {
              if (pNVar9 == (Node *)0x0) break;
              pTVar4 = pTVar3;
              pNVar6 = pNVar9;
              if (*(int *)pNVar9 == iVar1) goto LAB_001dfd79;
              pNVar9 = *(Node **)(pNVar9 + 0x10);
            } while (pNVar9 != pNVar2);
          }
          goto LAB_001dfd75;
        }
      }
      else {
        pNVar9 = *(Node **)(pNVar6 + 0x10);
        bVar10 = true;
        if (pNVar9 != pNVar2) {
          iVar1 = *(int *)pNVar6;
          do {
            if (pNVar9 == (Node *)0x0) break;
            pTVar4 = pTVar3;
            pNVar6 = pNVar9;
            if (*(int *)pNVar9 == iVar1) goto LAB_001dfd79;
            pNVar9 = *(Node **)(pNVar9 + 0x10);
          } while (pNVar9 != pNVar2);
        }
LAB_001dfd75:
        bVar10 = true;
        pNVar2 = (Node *)0x0;
        pTVar4 = pTVar3;
        pNVar6 = (Node *)0x0;
      }
LAB_001dfd79:
      NVar11.node = pNVar6;
      NVar11.start = (Node *)pTVar4;
    } while (bVar10);
  }
  return pTVar4;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;
			TypeHandle *rightArg = arguments.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}